

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall cmComputeLinkDepends::AddDirectLinkEntries(cmComputeLinkDepends *this)

{
  bool bVar1;
  cmLinkImplementation *libs;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *this_00;
  reference item;
  cmLinkItem *wi;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *__range1;
  cmLinkImplementation *impl;
  cmComputeLinkDepends *this_local;
  
  libs = cmGeneratorTarget::GetLinkImplementation(this->Target,&this->Config);
  AddLinkEntries<cmLinkImplItem>
            (this,-1,(vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)libs);
  this_00 = &(libs->super_cmLinkImplementationLibraries).WrongConfigLibraries;
  __end1 = std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin(this_00);
  wi = (cmLinkItem *)std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                                *)&wi);
    if (!bVar1) break;
    item = __gnu_cxx::
           __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
           ::operator*(&__end1);
    CheckWrongConfigItem(this,item);
    __gnu_cxx::
    __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void cmComputeLinkDepends::AddDirectLinkEntries()
{
  // Add direct link dependencies in this configuration.
  cmLinkImplementation const* impl =
    this->Target->GetLinkImplementation(this->Config);
  this->AddLinkEntries(-1, impl->Libraries);
  for (cmLinkItem const& wi : impl->WrongConfigLibraries) {
    this->CheckWrongConfigItem(wi);
  }
}